

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

void dgrminer::find_isolated_nodes_and_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_id,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_labels,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_changetime,
               PartialUnion pu,bool search_for_anomalies,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *occupied_node_ids_in_adj_list,
               int g_id,vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        *anomaly_pattern_edges,
               set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
               *anomaly_patterns,bool debug)

{
  int *piVar1;
  mapped_type mVar2;
  pointer paVar3;
  int *piVar4;
  int *piVar5;
  pointer pnVar6;
  pointer pnVar7;
  pointer pnVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  _Base_ptr p_Var12;
  pointer piVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  long lVar17;
  iterator iVar18;
  iterator iVar19;
  iterator iVar20;
  iterator iVar21;
  pointer piVar22;
  _Self __tmp;
  ulong uVar23;
  long lVar24;
  _Rb_tree_header *p_Var25;
  ulong uVar26;
  ulong uVar27;
  PartialUnion *this;
  size_t i;
  ulong uVar28;
  bool bVar29;
  reference rVar30;
  bool local_2a9;
  array<int,_10UL> anomaly_edge;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> vStack_230;
  vector<int,_std::allocator<int>_> which_indices_were_used;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  from_pattern_id_to_adj_id_map;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  maximal_patterns_of_addition_edges;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adj_list_nodes;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> anomaly_pattern_edges_all;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  vector_of_edge_sets;
  set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  sets_of_used_edges;
  vector<bool,_std::allocator<bool>_> adjacency_nodes_are_used;
  _Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_90;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_78;
  _Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_60;
  _Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_48;
  
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&adj_list_nodes,&adjacency_list->nodes);
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anomaly_edge._M_elems._0_8_ = anomaly_edge._M_elems._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&adjacency_nodes_are_used,
             ((long)adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)adj_list_nodes.
                   super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xc,(bool *)&anomaly_edge,
             (allocator_type *)&from_pattern_id_to_adj_id_map);
  anomaly_edge._M_elems._0_8_ = anomaly_edge._M_elems._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&which_indices_were_used,anomaly_edge._M_elems);
  p_Var12 = (_Base_ptr)(pu.labelEncoding._M_t._M_impl._0_8_ + 8);
  piVar4 = (pu.edges.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)->_M_elems;
  piVar5 = (pu.nodes.
            super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->_M_elems;
  iVar11 = 0;
  this = (PartialUnion *)pu._0_8_;
LAB_00139e64:
  do {
    piVar13 = (antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    piVar22 = (antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    uVar26 = (ulong)iVar11;
    if ((ulong)((long)piVar22 - (long)piVar13 >> 2) <= uVar26) {
      if ((antecedent_pattern_edges_ADDED->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (antecedent_pattern_edges_ADDED->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_ = 0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        lVar24 = 0;
        for (uVar23 = 0;
            uVar23 < (ulong)((*(long *)((pu.edges.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        _M_elems + 2) -
                             *(long *)(pu.edges.
                                       super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems
                             ) / 0x28); uVar23 = uVar23 + 1) {
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                     &from_pattern_id_to_adj_id_map,
                     (value_type *)
                     (*(long *)(pu.edges.
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems +
                     lVar24));
          lVar24 = lVar24 + 0x28;
        }
        anomaly_edge._M_elems[4] = 0;
        anomaly_edge._M_elems[5] = 0;
        anomaly_edge._M_elems[0] = 0;
        anomaly_edge._M_elems[1] = 0;
        anomaly_edge._M_elems[2] = 0;
        anomaly_edge._M_elems[3] = 0;
        anomaly_edge._M_elems[8] = 0;
        vStack_230.
        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_230.
        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_230.
        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &anomaly_edge,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &from_pattern_id_to_adj_id_map);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &local_60,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &from_pattern_id_to_adj_id_map);
        compute_min_code((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &sets_of_used_edges,
                         (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &local_60);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::_M_move_assign
                  (&vStack_230,&sets_of_used_edges);
        std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       *)&sets_of_used_edges);
        std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
        ~_Vector_base(&local_60);
        iVar21 = std::
                 _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                 ::find((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                         *)pu.labelEncoding._M_t._M_impl._0_8_,
                        (anomaly_pattern_with_occurrences *)&anomaly_edge);
        if (iVar21._M_node == p_Var12) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     (anomaly_edge._M_elems + 6),
                     (int *)&pu.edges.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          std::
          _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
          ::_M_insert_unique<dgrminer::anomaly_pattern_with_occurrences_const&>
                    ((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
                      *)pu.labelEncoding._M_t._M_impl._0_8_,
                     (anomaly_pattern_with_occurrences *)&anomaly_edge);
        }
        else {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &iVar21._M_node[1]._M_right,
                     (int *)&pu.edges.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        anomaly_pattern_with_occurrences::~anomaly_pattern_with_occurrences
                  ((anomaly_pattern_with_occurrences *)&anomaly_edge);
        std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       *)&from_pattern_id_to_adj_id_map);
      }
      else {
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (uVar23 = 0; uVar23 < (ulong)((long)piVar22 - (long)piVar13 >> 2); uVar23 = uVar23 + 1)
        {
          mVar2 = selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar23];
          anomaly_edge._M_elems[0]._0_1_ = (char)piVar13[uVar23];
          pmVar14 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[](&from_pattern_id_to_adj_id_map,(key_type_conflict *)&anomaly_edge);
          *pmVar14 = mVar2;
          piVar13 = (antecedent_pattern_isolated_node_id->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start;
          piVar22 = (antecedent_pattern_isolated_node_id->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_finish;
        }
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        find_addition_nodes_and_edges
                  (adjacency_list,antecedent_pattern_edges_ADDED,antecedent_pattern_node_id_ADDED,
                   antecedent_pattern_node_labels_ADDED,&from_pattern_id_to_adj_id_map,
                   &adj_list_nodes,&sets_of_used_edges,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   pu.nodes.
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   pu.nodes.
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (bool)(undefined1)
                         pu.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (p_Var15 = sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &sets_of_used_edges._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::push_back(&vector_of_edge_sets,(value_type *)(p_Var15 + 1));
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::vector(&local_78,&vector_of_edge_sets);
        find_maximal_subsets_of_ndve(&maximal_patterns_of_addition_edges,&local_78);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&local_78);
        for (uVar23 = 0;
            uVar23 < (ulong)(((long)maximal_patterns_of_addition_edges.
                                    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)maximal_patterns_of_addition_edges.
                                   super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x60);
            uVar23 = uVar23 + 1) {
          anomaly_pattern_edges_all.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anomaly_pattern_edges_all.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          anomaly_pattern_edges_all.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar24 = 0;
          for (uVar28 = 0;
              uVar28 < (ulong)((*(long *)((pu.edges.
                                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          _M_elems + 2) -
                               *(long *)(pu.edges.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        _M_elems) / 0x28); uVar28 = uVar28 + 1) {
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      (&anomaly_pattern_edges_all,
                       (value_type *)
                       (*(long *)(pu.edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems +
                       lVar24));
            lVar24 = lVar24 + 0x28;
          }
          lVar24 = 0;
          uVar27 = 0;
          uVar28 = 0;
          while( true ) {
            paVar3 = (antecedent_pattern_edges_ADDED->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar16 = ((long)(antecedent_pattern_edges_ADDED->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar3) / 0x28;
            if (uVar16 <= uVar27) break;
            for (lVar17 = 0; lVar17 != 10; lVar17 = lVar17 + 1) {
              anomaly_edge._M_elems[lVar17] = *(int *)((long)paVar3->_M_elems + lVar17 * 4 + lVar24)
              ;
            }
            iVar18 = std::
                     _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                     find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)(maximal_patterns_of_addition_edges.
                              super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar23),
                          paVar3[uVar27]._M_elems);
            pnVar6 = maximal_patterns_of_addition_edges.
                     super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar19 = std::
                     _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                     find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)(maximal_patterns_of_addition_edges.
                              super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar23),
                          (antecedent_pattern_edges_ADDED->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_elems + 1);
            pnVar7 = maximal_patterns_of_addition_edges.
                     super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar20 = std::
                     _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                     find(&maximal_patterns_of_addition_edges.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar23].non_dummy_edges._M_t,
                          (antecedent_pattern_edges_ADDED->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_elems + 9);
            pnVar8 = maximal_patterns_of_addition_edges.
                     super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2a9 = true;
            bVar29 = true;
            if ((_Rb_tree_header *)iVar18._M_node ==
                &pnVar6[uVar23].non_dummy_vertices._M_t._M_impl.super__Rb_tree_header) {
              bVar29 = (antecedent_pattern_edges_ADDED->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_elems[3] != 0;
            }
            if ((_Rb_tree_header *)iVar19._M_node ==
                &pnVar7[uVar23].non_dummy_vertices._M_t._M_impl.super__Rb_tree_header) {
              local_2a9 = (antecedent_pattern_edges_ADDED->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_elems[8] != 0;
            }
            if (bVar29 == false) {
              iVar9 = PartialUnion::getDummyLabel((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[2])
              ;
              anomaly_edge._M_elems[2] = iVar9;
            }
            if (local_2a9 == false) {
              anomaly_edge._M_elems[7] =
                   PartialUnion::getDummyLabel((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[7]);
            }
            p_Var25 = &pnVar8[uVar23].non_dummy_edges._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar20._M_node == p_Var25) {
              iVar9 = PartialUnion::getDummyLabel((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[5])
              ;
              anomaly_edge._M_elems[5] = iVar9;
            }
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      (&anomaly_pattern_edges_all,&anomaly_edge);
            uVar28 = (ulong)((int)uVar28 + (uint)(bVar29 ^ 1) + (uint)(local_2a9 ^ 1) +
                            (uint)((_Rb_tree_header *)iVar20._M_node == p_Var25));
            uVar27 = uVar27 + 1;
            lVar24 = lVar24 + 0x28;
            this = (PartialUnion *)pu._0_8_;
          }
          if (((*(long *)((pu.edges.
                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 2) !=
                *(long *)(pu.edges.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems) ||
              (uVar16 * 3 != uVar28)) ||
             (*(long *)(pu.nodes.
                        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[1]._M_elems + 4) == 0)) {
            anomaly_edge._M_elems[4] = 0;
            anomaly_edge._M_elems[5] = 0;
            anomaly_edge._M_elems[0] = 0;
            anomaly_edge._M_elems[1] = 0;
            anomaly_edge._M_elems[2] = 0;
            anomaly_edge._M_elems[3] = 0;
            anomaly_edge._M_elems[8] = 0;
            vStack_230.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_230.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_230.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &anomaly_edge,&anomaly_pattern_edges_all);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &local_90,&anomaly_pattern_edges_all);
            compute_min_code((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              *)&local_48,
                             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              *)&local_90);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
            _M_move_assign(&vStack_230,&local_48);
            std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
            ~_Vector_base(&local_48);
            std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
            ~_Vector_base(&local_90);
            iVar21 = std::
                     _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                     ::find((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                             *)pu.labelEncoding._M_t._M_impl._0_8_,
                            (anomaly_pattern_with_occurrences *)&anomaly_edge);
            if (iVar21._M_node == p_Var12) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )(anomaly_edge._M_elems + 6),
                         (int *)&pu.edges.
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
              std::
              _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
              ::_M_insert_unique<dgrminer::anomaly_pattern_with_occurrences_const&>
                        ((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
                          *)pu.labelEncoding._M_t._M_impl._0_8_,
                         (anomaly_pattern_with_occurrences *)&anomaly_edge);
            }
            else {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&iVar21._M_node[1]._M_right,
                         (int *)&pu.edges.
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            }
            anomaly_pattern_with_occurrences::~anomaly_pattern_with_occurrences
                      ((anomaly_pattern_with_occurrences *)&anomaly_edge);
          }
          std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
          ~_Vector_base(&anomaly_pattern_edges_all.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       );
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&maximal_patterns_of_addition_edges);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&vector_of_edge_sets);
        std::
        _Rb_tree<dgrminer::non_dummy_vertices_and_edges,_dgrminer::non_dummy_vertices_and_edges,_std::_Identity<dgrminer::non_dummy_vertices_and_edges>,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~_Rb_tree(&sets_of_used_edges._M_t);
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::~_Rb_tree(&from_pattern_id_to_adj_id_map._M_t);
      }
      if ((antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
          _M_impl.super__Vector_impl_data._M_start) break;
    }
    iVar9 = which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26];
    while( true ) {
      anomaly_edge._M_elems[0] = iVar9;
      uVar28 = (ulong)iVar9;
      uVar23 = ((long)adj_list_nodes.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)adj_list_nodes.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      if (uVar23 <= uVar28) break;
      iVar18 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )pu.edges.
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,anomaly_edge._M_elems);
      iVar19 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )pu.nodes.
                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,anomaly_edge._M_elems);
      rVar30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&adjacency_nodes_are_used,(long)anomaly_edge._M_elems[0]);
      if (((iVar18._M_node == (_Base_ptr)(piVar4 + 2)) && ((rVar30._M_mask & *rVar30._M_p) == 0)) &&
         (iVar19._M_node == (_Base_ptr)(piVar5 + 2))) {
        iVar9 = PartialUnion::getAntecedentLabel
                          (this,adj_list_nodes.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[anomaly_edge._M_elems[0]].
                                _M_elems[2]);
        iVar10 = PartialUnion::getAntecedentLabel
                           (this,(antecedent_pattern_isolated_node_labels->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[uVar26]);
        if (iVar9 == iVar10) {
          iVar9 = PartialUnion::getAntecedentChangetime
                            (this,adj_list_nodes.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [anomaly_edge._M_elems[0]]._M_elems[1]);
          iVar10 = PartialUnion::getAntecedentChangetime
                             (this,(antecedent_pattern_isolated_node_changetime->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar26]);
          if (iVar9 == iVar10) {
            which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] = anomaly_edge._M_elems[0] + 1;
            from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_ =
                 from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_ & 0xffffffff00000000;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&which_indices_were_used,(int *)&from_pattern_id_to_adj_id_map);
            std::vector<int,_std::allocator<int>_>::push_back
                      (&selected_ids_from_adj,
                       adj_list_nodes.
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[anomaly_edge._M_elems[0]]._M_elems)
            ;
            rVar30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&adjacency_nodes_are_used,(long)anomaly_edge._M_elems[0]);
            *rVar30._M_p = *rVar30._M_p | rVar30._M_mask;
            iVar11 = iVar11 + 1;
            if (iVar11 != 0) {
              if (uVar23 <= uVar28) goto LAB_0013a65c;
              goto LAB_00139e64;
            }
            iVar11 = 0;
            if (uVar23 <= uVar28) goto LAB_0013a741;
            goto LAB_00139e64;
          }
        }
      }
      iVar9 = anomaly_edge._M_elems[0] + 1;
    }
    if (iVar11 == 0) break;
LAB_0013a65c:
    piVar1 = which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + -2;
    which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    rVar30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&adjacency_nodes_are_used,(long)*piVar1 - 1);
    *rVar30._M_p = *rVar30._M_p & ~rVar30._M_mask;
    selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
LAB_0013a741:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
            (&adj_list_nodes.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>);
  return;
}

Assistant:

void find_isolated_nodes_and_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::vector<int> & antecedent_pattern_isolated_node_id,
		std::vector<int> & antecedent_pattern_isolated_node_labels,
		std::vector<int> & antecedent_pattern_isolated_node_changetime, PartialUnion pu, bool search_for_anomalies,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		std::set<int> & occupied_node_ids_in_adj_list,
		int g_id,
		std::vector<std::array<int, PAT___SIZE>> & anomaly_pattern_edges,
		std::set<anomaly_pattern_with_occurrences> & anomaly_patterns,
		bool debug)
	{
		std::vector<std::array<int, ADJ_NODES___SIZE>> adj_list_nodes = adjacency_list.nodes;
		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<int> which_indices_were_used; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		// DO DFS:

		int isolated_vertex_current_index = 0; // we want to process the the first isolated vertex
		which_indices_were_used.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		while (true)
		{
			// if all isolated nodes were mapped (found):
			if (antecedent_pattern_isolated_node_id.size() <= isolated_vertex_current_index)
			{
				// and there are no addition edges (and thus also no addition nodes because of the connectedness of the pattern), just save the pattern:
				if (antecedent_pattern_edges_ADDED.size() == 0)
				{
					std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
					for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
					{
						anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
					}
					// save the anomalous pattern with its occurrences - only regular edges
					anomaly_pattern_with_occurrences ap;
					ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
					ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
					auto it = anomaly_patterns.find(ap);
					if (it != std::end(anomaly_patterns))
					{

						(it->occurrences).insert(g_id);
					}
					else
					{
						ap.occurrences.insert(g_id);
						anomaly_patterns.insert(ap);
					}
				}
				// but if there are also some addition edges (possibly with addition nodes), try to find them:
				else
				{
					std::map<char, int> from_pattern_id_to_adj_id_map;
					for (size_t i = 0; i < antecedent_pattern_isolated_node_id.size(); i++)
					{
						from_pattern_id_to_adj_id_map[antecedent_pattern_isolated_node_id[i]] = selected_ids_from_adj[i];
					}

					// OUTPUT of find_addition_nodes_and_edges will be here:
					std::set<non_dummy_vertices_and_edges> sets_of_used_edges;
					find_addition_nodes_and_edges(adjacency_list, antecedent_pattern_edges_ADDED, antecedent_pattern_node_id_ADDED, antecedent_pattern_node_labels_ADDED, from_pattern_id_to_adj_id_map,
						adj_list_nodes, sets_of_used_edges, nodes_occupied_by_antecedent, edges_occupied_by_antecedent, debug);
					// process sets_of_used_edges (keep only maximal subsets)
					std::vector<non_dummy_vertices_and_edges> vector_of_edge_sets;
					for (set< non_dummy_vertices_and_edges >::iterator new_it = sets_of_used_edges.begin(); new_it != sets_of_used_edges.end(); new_it++)
					{
						vector_of_edge_sets.push_back(*new_it);
					}
					// here we get the IDs of non-dummy pattern edges and nodes; only maximal subsets (all other IDs are dummy)

					std::vector<non_dummy_vertices_and_edges> maximal_patterns_of_addition_edges = find_maximal_subsets_of_ndve(vector_of_edge_sets);

					// now for each such maximal set of addition patterns, create one anomaly pattern:
					for (size_t i = 0; i < maximal_patterns_of_addition_edges.size(); i++)
					{
						std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
						for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
						{
							anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
						}

						// add addition edges to anomaly_pattern_edges_all:
						// we need to mark dummy vertices and edges:

						int num_of_dummy_elements = 0;

                        // checking these addition edges:
						for (size_t j = 0; j < antecedent_pattern_edges_ADDED.size(); j++)
						{
							std::array<int, PAT___SIZE> anomaly_edge;
							// first just copy the edge as it is:
							for (size_t k = 0; k < PAT___SIZE; k++)
							{
								anomaly_edge[k] = antecedent_pattern_edges_ADDED[j][k];
							}
							
							// then, if there are some dummy elements, modify them:
							// if they were "addition nodes" then we must check it by using the results from find_addition_nodes_and_edges()
							bool is_src_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_SRC_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_dst_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_DST_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_edge_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_edges.find(antecedent_pattern_edges_ADDED[j][PAT_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_edges.end();

							// if they are not "addition" nodes, then it is clear that these nodes are not dummy:
							is_src_vertex_nondummy = is_src_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_SRC_CHANGETIME] != 0);
							is_dst_vertex_nondummy = is_dst_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_DST_CHANGETIME] != 0);

							if (!is_src_vertex_nondummy) anomaly_edge[PAT_SRC_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_SRC_LABEL]);
							if (!is_dst_vertex_nondummy) anomaly_edge[PAT_DST_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_DST_LABEL]);
							if (!is_edge_nondummy) anomaly_edge[PAT_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_LABEL]);

							num_of_dummy_elements += (!is_src_vertex_nondummy + !is_dst_vertex_nondummy + !is_edge_nondummy);

							anomaly_pattern_edges_all.push_back(anomaly_edge);
						}

						// if there are no regular edges from the antecedent and all "ADDITION" edges contain only DUMMY elements, then the pattern is pure "ADDITION-DUMMY"
						bool is_only_addition_pattern = (anomaly_pattern_edges.size() == 0) && (antecedent_pattern_edges_ADDED.size() * 3 == num_of_dummy_elements);

						// we cannot save patterns which are pure "ADDITION-DUMMY" if the current snapshot contain the frequent pattern
						// (more precisely, we don't save the occurrence)
						if (!is_only_addition_pattern || nodes_occupied_by_antecedent.size() == 0)
						{
							// and now save the anomalous pattern with its occurrences 
							anomaly_pattern_with_occurrences ap;
							ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
							ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
							auto it = anomaly_patterns.find(ap);
							if (it != std::end(anomaly_patterns))
							{

								(it->occurrences).insert(g_id);
							}
							else
							{
								ap.occurrences.insert(g_id);
								anomaly_patterns.insert(ap);
							}
						}


					}
				}
                // ALL FOUND ISOLATED VERTICES PROCESSED

				// if there were no isolated vertices, just end after all anomaly patterns were saved
				if (antecedent_pattern_isolated_node_id.size() == 0)
				{
					return;
				}

				// NOW WE may try different solution
			}

			// try to map next isolated node:
			bool should_backtrack = true;
			for (int node_candidate_index = which_indices_were_used[isolated_vertex_current_index]; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				// if the current adjacency node wasn't used yet, AND it ins't occupied by the mapped antecedent edges, AND it is not occupied by the FREQUENT PATTERN antecedent:
				bool is_occupied_in_adj_nodes = occupied_node_ids_in_adj_list.find(node_candidate_index) != occupied_node_ids_in_adj_list.end();
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(node_candidate_index) != nodes_occupied_by_antecedent.end();
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_in_adj_nodes && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = pu.getAntecedentLabel(adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL]) == pu.getAntecedentLabel(antecedent_pattern_isolated_node_labels[isolated_vertex_current_index]) &&
						pu.getAntecedentChangetime(adj_list_nodes[node_candidate_index][ADJ_NODES_CHANGETIME]) == pu.getAntecedentChangetime(antecedent_pattern_isolated_node_changetime[isolated_vertex_current_index]);

					if (are_same)
					{
						should_backtrack = false;

						which_indices_were_used[isolated_vertex_current_index] = node_candidate_index + 1;
						which_indices_were_used.push_back(0);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index++;
						break;
					}
				}
			}

			// if we could not map this isolated vertex, backtrack:
			if (isolated_vertex_current_index != 0 && should_backtrack)
			{
				which_indices_were_used.pop_back();

				adjacency_nodes_are_used[which_indices_were_used.back() - 1] = false;

				selected_ids_from_adj.pop_back();

				isolated_vertex_current_index--;
			}
			if (isolated_vertex_current_index == 0 && should_backtrack)
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}